

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall CClient::Run(CClient *this)

{
  int *piVar1;
  long lVar2;
  IKernel *pIVar3;
  long lVar4;
  NETADDR BindAddr;
  NETADDR BindAddr_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  int64 iVar8;
  IEngineGraphics *pIVar9;
  undefined8 uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int64 iVar11;
  char *fmt;
  long in_FS_OFFSET;
  float fVar12;
  char aBuf [256];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = time_get();
  this->m_LocalStartTime = iVar8;
  this->m_SnapshotParts = 0;
  iVar6 = SDL_Init(0);
  if (iVar6 < 0) {
    uVar10 = SDL_GetError();
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      dbg_msg("client","unable to init SDL base: %s",uVar10);
      return;
    }
    goto LAB_0011b7bf;
  }
  atexit(SDL_Quit);
  pIVar9 = CreateEngineGraphicsThreaded();
  this->m_pGraphics = pIVar9;
  pIVar3 = (this->super_IClient).super_IInterface.m_pKernel;
  iVar6 = (**pIVar3->_vptr_IKernel)(pIVar3,"enginegraphics",pIVar9);
  if ((((char)iVar6 == '\0') ||
      (pIVar3 = (this->super_IClient).super_IInterface.m_pKernel,
      iVar6 = (**pIVar3->_vptr_IKernel)(pIVar3,"graphics",this->m_pGraphics), (char)iVar6 == '\0'))
     || (iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x2b])(),
        iVar6 != 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      dbg_msg("client","couldn\'t init graphics");
      return;
    }
    goto LAB_0011b7bf;
  }
  iVar6 = (*(this->m_pSound->super_ISound).super_IInterface._vptr_IInterface[0xc])();
  this->m_SoundInitFailed = iVar6 != 0;
  (*(this->m_pSound->super_ISound).super_IInterface._vptr_IInterface[6])
            ((float)(this->m_pGraphics->super_IGraphics).m_ScreenWidth * 1.5 * 0.5);
  if ((this->m_pConfig->m_Bindaddr[0] == '\0') ||
     (iVar6 = net_host_lookup(this->m_pConfig->m_Bindaddr,(NETADDR *)aBuf,3), iVar6 != 0)) {
    mem_zero(aBuf,0x18);
  }
  aBuf[0] = '\x03';
  aBuf[1] = '\0';
  aBuf[2] = '\0';
  aBuf[3] = '\0';
  BindAddr.port._0_1_ = aBuf[0x14];
  BindAddr.port._1_1_ = aBuf[0x15];
  BindAddr.ip[0xc] = aBuf[0x10];
  BindAddr.ip[0xd] = aBuf[0x11];
  BindAddr.ip[0xe] = aBuf[0x12];
  BindAddr.ip[0xf] = aBuf[0x13];
  BindAddr.reserved._0_1_ = aBuf[0x16];
  BindAddr.reserved._1_1_ = aBuf[0x17];
  BindAddr.ip[0] = aBuf[4];
  BindAddr.ip[1] = aBuf[5];
  BindAddr.ip[2] = aBuf[6];
  BindAddr.ip[3] = aBuf[7];
  BindAddr.type = 3;
  BindAddr.ip[4] = aBuf[8];
  BindAddr.ip[5] = aBuf[9];
  BindAddr.ip[6] = aBuf[10];
  BindAddr.ip[7] = aBuf[0xb];
  BindAddr.ip[8] = aBuf[0xc];
  BindAddr.ip[9] = aBuf[0xd];
  BindAddr.ip[10] = aBuf[0xe];
  BindAddr.ip[0xb] = aBuf[0xf];
  bVar5 = CNetClient::Open(&this->m_NetClient,BindAddr,this->m_pConfig,this->m_pConsole,
                           this->m_pEngine,(uint)(aBuf._20_2_ == 0));
  if (bVar5) {
    aBuf[0x14] = '\0';
    aBuf[0x15] = '\0';
    BindAddr_00.port = 0;
    BindAddr_00.ip[0xc] = aBuf[0x10];
    BindAddr_00.ip[0xd] = aBuf[0x11];
    BindAddr_00.ip[0xe] = aBuf[0x12];
    BindAddr_00.ip[0xf] = aBuf[0x13];
    BindAddr_00.reserved._0_1_ = aBuf[0x16];
    BindAddr_00.reserved._1_1_ = aBuf[0x17];
    BindAddr_00.ip[0] = aBuf[4];
    BindAddr_00.ip[1] = aBuf[5];
    BindAddr_00.ip[2] = aBuf[6];
    BindAddr_00.ip[3] = aBuf[7];
    BindAddr_00.type._0_1_ = aBuf[0];
    BindAddr_00.type._1_1_ = aBuf[1];
    BindAddr_00.type._2_1_ = aBuf[2];
    BindAddr_00.type._3_1_ = aBuf[3];
    BindAddr_00.ip[4] = aBuf[8];
    BindAddr_00.ip[5] = aBuf[9];
    BindAddr_00.ip[6] = aBuf[10];
    BindAddr_00.ip[7] = aBuf[0xb];
    BindAddr_00.ip[8] = aBuf[0xc];
    BindAddr_00.ip[9] = aBuf[0xd];
    BindAddr_00.ip[10] = aBuf[0xe];
    BindAddr_00.ip[0xb] = aBuf[0xf];
    bVar5 = CNetClient::Open(&this->m_ContactClient,BindAddr_00,this->m_pConfig,this->m_pConsole,
                             this->m_pEngine,0);
    if (!bVar5) {
      fmt = "couldn\'t open socket(contact)";
      goto LAB_0011b736;
    }
    (*(this->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x14])();
    (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[0x1a])();
    (*(this->m_pMasterServer->super_IMasterServer).super_IInterface._vptr_IInterface[6])
              (this->m_pMasterServer,
               (ulong)(uint)(this->m_ContactClient).super_CNetBase.m_Socket.type);
    (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[4])();
    iVar6 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x13])();
    str_format(aBuf,0x100,"netversion %s",CONCAT44(extraout_var,iVar6));
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"client",aBuf,0);
    iVar6 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x14])();
    iVar7 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x15])();
    iVar6 = str_comp((char *)CONCAT44(extraout_var_00,iVar6),(char *)CONCAT44(extraout_var_01,iVar7)
                    );
    if (iVar6 != 0) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"client","WARNING: netversion hash differs",0);
    }
    iVar6 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x12])();
    str_format(aBuf,0x100,"game version %s",CONCAT44(extraout_var_02,iVar6));
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"client",aBuf,0);
    (this->m_FpsGraph).m_Min = 0.0;
    (this->m_FpsGraph).m_Max = 120.0;
    (this->m_FpsGraph).m_MinRange = 0.0;
    (this->m_FpsGraph).m_MaxRange = 120.0;
    (this->m_FpsGraph).m_Index = 0;
    this->m_pConfig->m_ClEditor = 0;
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x10])(this->m_pConsole,0);
LAB_0011b367:
    VersionUpdate(this);
    if (this->m_aCmdConnect[0] != '\0') {
      (*(this->super_IClient).super_IInterface._vptr_IInterface[2])(this,this->m_aCmdConnect);
      this->m_aCmdConnect[0] = '\0';
    }
    iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[0x1b])();
    if (iVar6 != 0) goto LAB_0011b74f;
    (*(this->m_pSound->super_ISound).super_IInterface._vptr_IInterface[0xd])();
    iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])();
    if (iVar6 == 0) {
      if (this->m_WindowMustRefocus == 0) goto LAB_0011b3f5;
LAB_0011b3ff:
      this->m_WindowMustRefocus = 1;
LAB_0011b409:
      iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])();
      if (iVar6 != 0) {
        if (this->m_WindowMustRefocus < 3) {
          (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[10])();
          iVar6 = this->m_WindowMustRefocus;
          this->m_WindowMustRefocus = iVar6 + 1;
          if ((iVar6 < 2) &&
             (iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                                (this->m_pInput,0x19b,1), (char)iVar6 == '\0')) goto LAB_0011b48d;
        }
        (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[9])();
        this->m_WindowMustRefocus = 0;
        iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x31])();
        if ((-1 < iVar6) && (iVar6 != this->m_pConfig->m_GfxScreen)) {
          this->m_pConfig->m_GfxScreen = iVar6;
        }
      }
    }
    else {
      if ((this->m_pConfig->m_DbgFocus != 0) &&
         (iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                            (this->m_pInput,0x1b,1), (char)iVar6 != '\0')) {
LAB_0011b3f5:
        (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[10])();
        goto LAB_0011b3ff;
      }
      if (this->m_WindowMustRefocus != 0) goto LAB_0011b409;
    }
LAB_0011b48d:
    iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[4])
                      (this->m_pInput,0x160);
    iVar7 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[4])
                      (this->m_pInput,0x161);
    if (((char)iVar6 == '\0') || ((char)iVar7 == '\0')) {
LAB_0011b543:
      if (this->m_pConfig->m_ClEditor == 0) {
        if (this->m_EditorActive != false) {
          bVar5 = false;
          goto LAB_0011b57b;
        }
      }
      else if (this->m_EditorActive == false) {
        (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0xf])();
        (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[9])();
        bVar5 = true;
LAB_0011b57b:
        this->m_EditorActive = bVar5;
      }
      (*(this->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x15])();
      Update(this);
      bVar5 = LimitFps(this);
      if ((!bVar5) &&
         ((this->m_pConfig->m_GfxAsyncRender == 0 ||
          (iVar6 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x29])()
          , (char)iVar6 != '\0')))) {
        this->m_RenderFrames = this->m_RenderFrames + 1;
        iVar8 = time_get();
        lVar4 = this->m_LastRenderTime;
        iVar11 = time_freq();
        fVar12 = (float)(iVar8 - lVar4) / (float)iVar11;
        (this->super_IClient).m_RenderFrameTime = fVar12;
        if (fVar12 < this->m_RenderFrameTimeLow) {
          this->m_RenderFrameTimeLow = fVar12;
        }
        if (this->m_RenderFrameTimeHigh <= fVar12 && fVar12 != this->m_RenderFrameTimeHigh) {
          this->m_RenderFrameTimeHigh = fVar12;
        }
        CGraph::Add(&this->m_FpsGraph,1.0 / fVar12,1.0,1.0,1.0);
        this->m_LastRenderTime = iVar8;
        if ((this->m_pConfig->m_DbgStress == 0) || (this->m_RenderFrames % 10 == 0)) {
          Render(this);
          (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x26])();
        }
      }
      AutoScreenshot_Cleanup(this);
      if ((this->super_IClient).m_State == 5) goto LAB_0011b74f;
      iVar6 = this->m_pConfig->m_ClCpuThrottle;
      if ((iVar6 == 0) && (iVar6 = 5, this->m_pConfig->m_DbgStress == 0)) {
        iVar7 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])();
        iVar6 = 5;
        if (iVar7 == 0) goto LAB_0011b6b2;
      }
      else {
LAB_0011b6b2:
        thread_sleep(iVar6);
      }
      iVar6 = this->m_pConfig->m_DbgHitch;
      if (iVar6 != 0) {
        thread_sleep(iVar6);
        this->m_pConfig->m_DbgHitch = 0;
      }
      iVar8 = time_get();
      lVar4 = this->m_LocalStartTime;
      iVar11 = time_freq();
      (this->super_IClient).m_LocalTime = (float)(iVar8 - lVar4) / (float)iVar11;
      goto LAB_0011b367;
    }
    iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                      (this->m_pInput,0x71,1);
    if ((char)iVar6 == '\0') {
      iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                        (this->m_pInput,100,1);
      if ((char)iVar6 != '\0') {
        piVar1 = &this->m_pConfig->m_Debug;
        *piVar1 = *piVar1 ^ 1;
      }
      iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                        (this->m_pInput,0x67,1);
      if ((char)iVar6 != '\0') {
        piVar1 = &this->m_pConfig->m_DbgGraphs;
        *piVar1 = *piVar1 ^ 1;
      }
      iVar6 = (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[5])
                        (this->m_pInput,0x65,1);
      if ((char)iVar6 != '\0') {
        piVar1 = &this->m_pConfig->m_ClEditor;
        *piVar1 = *piVar1 ^ 1;
        (*(this->m_pInput->super_IInput).super_IInterface._vptr_IInterface[9])();
      }
      goto LAB_0011b543;
    }
    (*(this->super_IClient).super_IInterface._vptr_IInterface[4])(this);
LAB_0011b74f:
    (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[8])();
    (*(this->super_IClient).super_IInterface._vptr_IInterface[3])(this);
    (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x2c])();
    (*(this->m_pSound->super_ISound).super_IInterface._vptr_IInterface[0xe])();
    (*(this->m_pTextRender->super_ITextRender).super_IInterface._vptr_IInterface[0x16])();
    CServerBrowser::SaveServerlist(&this->m_ServerBrowser);
    SDL_Quit();
  }
  else {
    fmt = "couldn\'t open socket(net)";
LAB_0011b736:
    dbg_msg("client",fmt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_0011b7bf:
  __stack_chk_fail();
}

Assistant:

void CClient::Run()
{
	m_LocalStartTime = time_get();
	m_SnapshotParts = 0;

	// init SDL
	{
		if(SDL_Init(0) < 0)
		{
			dbg_msg("client", "unable to init SDL base: %s", SDL_GetError());
			return;
		}

		atexit(SDL_Quit); // ignore_convention
	}

	// init graphics
	{
		m_pGraphics = CreateEngineGraphicsThreaded();

		bool RegisterFail = false;
		RegisterFail = RegisterFail || !Kernel()->RegisterInterface(static_cast<IEngineGraphics*>(m_pGraphics)); // register graphics as both
		RegisterFail = RegisterFail || !Kernel()->RegisterInterface(static_cast<IGraphics*>(m_pGraphics));

		if(RegisterFail || m_pGraphics->Init() != 0)
		{
			dbg_msg("client", "couldn't init graphics");
			return;
		}
	}

	// init sound, allowed to fail
	m_SoundInitFailed = Sound()->Init() != 0;
	Sound()->SetMaxDistance(1.5f*Graphics()->ScreenWidth()/2.0f);

	// open socket
	{
		NETADDR BindAddr;
		if(Config()->m_Bindaddr[0] && net_host_lookup(Config()->m_Bindaddr, &BindAddr, NETTYPE_ALL) == 0)
		{
			// got bindaddr
			BindAddr.type = NETTYPE_ALL;
		}
		else
		{
			mem_zero(&BindAddr, sizeof(BindAddr));
			BindAddr.type = NETTYPE_ALL;
		}
		if(!m_NetClient.Open(BindAddr, Config(), Console(), Engine(), BindAddr.port ? 0 : NETCREATE_FLAG_RANDOMPORT))
		{
			dbg_msg("client", "couldn't open socket(net)");
			return;
		}
		BindAddr.port = 0;
		if(!m_ContactClient.Open(BindAddr, Config(), Console(), Engine(), 0))
		{
			dbg_msg("client", "couldn't open socket(contact)");
			return;
		}
	}

	// init font rendering
	m_pTextRender->Init();

	// init the input
	Input()->Init();

	// start refreshing addresses while we load
	MasterServer()->RefreshAddresses(m_ContactClient.NetType());

	GameClient()->OnInit();

	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "netversion %s", GameClient()->NetVersion());
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);
	if(str_comp(GameClient()->NetVersionHashUsed(), GameClient()->NetVersionHashReal()))
	{
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", "WARNING: netversion hash differs");
	}
	str_format(aBuf, sizeof(aBuf), "game version %s", GameClient()->Version());
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);

	//
	m_FpsGraph.Init(0.0f, 120.0f);

	// never start with the editor
	Config()->m_ClEditor = 0;

	// process pending commands
	m_pConsole->StoreCommands(false);

	while (1)
	{
		//
		VersionUpdate();

		// handle pending connects
		if(m_aCmdConnect[0])
		{
			Connect(m_aCmdConnect);
			m_aCmdConnect[0] = 0;
		}

		// update input
		if(Input()->Update())
			break;	// SDL_QUIT

		// update sound
		Sound()->Update();

		// release focus
		if(!m_pGraphics->WindowActive())
		{
			if(m_WindowMustRefocus == 0)
				Input()->MouseModeAbsolute();
			m_WindowMustRefocus = 1;
		}
		else if (Config()->m_DbgFocus && Input()->KeyPress(KEY_ESCAPE, true))
		{
			Input()->MouseModeAbsolute();
			m_WindowMustRefocus = 1;
		}

		// refocus
		if(m_WindowMustRefocus && m_pGraphics->WindowActive())
		{
			if(m_WindowMustRefocus < 3)
			{
				Input()->MouseModeAbsolute();
				m_WindowMustRefocus++;
			}

			if(m_WindowMustRefocus >= 3 || Input()->KeyPress(KEY_MOUSE_1, true))
			{
				Input()->MouseModeRelative();
				m_WindowMustRefocus = 0;

				// update screen in case it got moved
				int ActScreen = Graphics()->GetWindowScreen();
				if(ActScreen >= 0 && ActScreen != Config()->m_GfxScreen)
					Config()->m_GfxScreen = ActScreen;
			}
		}

		// panic quit button
		bool IsCtrlPressed = Input()->KeyIsPressed(KEY_LCTRL);
		bool IsLShiftPressed = Input()->KeyIsPressed(KEY_LSHIFT);
		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_Q, true))
		{
			Quit();
			break;
		}

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_D, true))
			Config()->m_Debug ^= 1;

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_G, true))
			Config()->m_DbgGraphs ^= 1;

		if(IsCtrlPressed && IsLShiftPressed && Input()->KeyPress(KEY_E, true))
		{
			Config()->m_ClEditor = Config()->m_ClEditor^1;
			Input()->MouseModeRelative();
		}

		// render
		{
			if(Config()->m_ClEditor)
			{
				if(!m_EditorActive)
				{
					GameClient()->OnActivateEditor();
					Input()->MouseModeRelative();
					m_EditorActive = true;
				}
			}
			else if(m_EditorActive)
				m_EditorActive = false;
			
			m_pTextRender->Update();

			Update();

			const bool SkipFrame = LimitFps();

			if(!SkipFrame && (!Config()->m_GfxAsyncRender || m_pGraphics->IsIdle()))
			{
				m_RenderFrames++;

				// update frametime
				int64 Now = time_get();
				m_RenderFrameTime = (Now - m_LastRenderTime) / (float)time_freq();

				if(m_RenderFrameTime < m_RenderFrameTimeLow)
					m_RenderFrameTimeLow = m_RenderFrameTime;
				if(m_RenderFrameTime > m_RenderFrameTimeHigh)
					m_RenderFrameTimeHigh = m_RenderFrameTime;
				m_FpsGraph.Add(1.0f/m_RenderFrameTime, 1,1,1);

				m_LastRenderTime = Now;

				// when we are stress testing only render every 10th frame
				if(!Config()->m_DbgStress || (m_RenderFrames%10) == 0 )
				{
					Render();
					m_pGraphics->Swap();
				}
			}
		}

		AutoScreenshot_Cleanup();

		// check conditions
		if(State() == IClient::STATE_QUITING)
			break;

		// beNice
		if(Config()->m_ClCpuThrottle)
			thread_sleep(Config()->m_ClCpuThrottle);
		else if(Config()->m_DbgStress || !m_pGraphics->WindowActive())
			thread_sleep(5);

		if(Config()->m_DbgHitch)
		{
			thread_sleep(Config()->m_DbgHitch);
			Config()->m_DbgHitch = 0;
		}

		/*
		if(ReportTime < time_get())
		{
			if(0 && Config()->m_Debug)
			{
				dbg_msg("client/report", "fps=%.02f (%.02f %.02f) netstate=%d",
					m_Frames/(float)(ReportInterval/time_freq()),
					1.0f/m_RenderFrameTimeHigh,
					1.0f/m_RenderFrameTimeLow,
					m_NetClient.State());
			}
			m_RenderFrameTimeLow = 1;
			m_RenderFrameTimeHigh = 0;
			m_RenderFrames = 0;
			ReportTime += ReportInterval;
		}*/

		// update local time
		m_LocalTime = (time_get()-m_LocalStartTime)/(float)time_freq();
	}

	GameClient()->OnShutdown();
	Disconnect();

	m_pGraphics->Shutdown();
	m_pSound->Shutdown();
	m_pTextRender->Shutdown();

	m_ServerBrowser.SaveServerlist();

	// shutdown SDL
	SDL_Quit();
}